

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  uint rgb_dir;
  int iVar1;
  undefined4 in_register_00000014;
  
  rgb_dir = (uint)((comp - 2U & 0xfffffffd) == 0);
  iVar1 = outfile(filename,rgb_dir,y,x,y,comp,0,data,rgb_dir,0,"111 221 2222 11",0,0,
                  (ulong)((int)(comp - rgb_dir) < 2 | 2),0,0,0,0,0,x,
                  CONCAT44(in_register_00000014,y),(ulong)(uint)(comp * 8),(ulong)(rgb_dir * 8));
  return iVar1;
}

Assistant:

int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3
   return outfile(filename, -1,-1, x, y, comp, 0, (void *) data, has_alpha, 0,
                  "111 221 2222 11", 0,0,format, 0,0,0, 0,0,x,y, (colorbytes+has_alpha)*8, has_alpha*8);
}